

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O3

void __thiscall MPLSParser::parse(MPLSParser *this,uint8_t *buffer,int len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  BitStreamReader reader;
  ostringstream ss;
  BitStreamReader local_1d0;
  uint8_t *local_1b0;
  
  local_1d0.super_BitStream.m_totalBits = 0;
  local_1d0.super_BitStream.m_buffer = (uint *)0x0;
  local_1d0.super_BitStream.m_initBuffer = (uint *)0x0;
  local_1d0.m_curVal = 0;
  local_1d0.m_bitLeft = 0;
  BitStream::setBuffer(&local_1d0.super_BitStream,buffer,buffer + len);
  local_1d0._24_8_ = local_1d0._24_8_ & 0xffffffff;
  local_1d0.m_curVal = BitStreamReader::getCurVal(&local_1d0,local_1d0.super_BitStream.m_buffer);
  local_1d0.m_bitLeft = 0x20;
  lVar5 = 4;
  do {
    BitStreamReader::getBits(&local_1d0,8);
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  lVar5 = 4;
  do {
    BitStreamReader::getBits(&local_1d0,8);
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  local_1b0 = buffer + len;
  uVar1 = BitStreamReader::getBits(&local_1d0,0x20);
  uVar2 = BitStreamReader::getBits(&local_1d0,0x20);
  uVar3 = BitStreamReader::getBits(&local_1d0,0x20);
  iVar4 = 5;
  do {
    BitStreamReader::skipBits(&local_1d0,0x20);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  AppInfoPlayList(this,&local_1d0);
  parsePlayList(this,buffer + (int)uVar1,len - uVar1);
  parsePlayListMark(this,buffer + (int)uVar2,len - uVar2);
  if (uVar3 != 0) {
    parseExtensionData(this,buffer + (int)uVar3,local_1b0);
  }
  return;
}

Assistant:

void MPLSParser::parse(uint8_t* buffer, const int len)
{
    BitStreamReader reader{};
    try
    {
        reader.setBuffer(buffer, buffer + len);
        char type_indicator[5];
        char version_number[5];
        CLPIStreamInfo::readString(type_indicator, reader, 4);
        CLPIStreamInfo::readString(version_number, reader, 4);
        const int playList_start_address = reader.getBits<int>(32);
        const int playListMark_start_address = reader.getBits<int>(32);
        const int extensionData_start_address = reader.getBits<int>(32);
        for (int i = 0; i < 5; i++) reader.skipBits(32);  // reserved_for_future_use
        AppInfoPlayList(reader);
        parsePlayList(buffer + playList_start_address, len - playList_start_address);
        parsePlayListMark(buffer + playListMark_start_address, len - playListMark_start_address);

        if (extensionData_start_address)
        {
            parseExtensionData(buffer + extensionData_start_address, buffer + len);
        }
    }
    catch (BitStreamException&)
    {
        THROW(ERR_COMMON, "Can't parse media playlist file: unexpected end of data")
    }
}